

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeInputsBeProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  int *piVar6;
  char *pcVar7;
  ostream *poVar8;
  string local_68 [8];
  string shadowing_disk_file;
  string virtual_file;
  int i;
  DiskSourceTree *source_tree_local;
  CommandLineInterface *this_local;
  
  for (virtual_file.field_2._12_4_ = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->input_files_), (ulong)(long)(int)virtual_file.field_2._12_4_ < sVar4;
      virtual_file.field_2._12_4_ = virtual_file.field_2._12_4_ + 1) {
    std::__cxx11::string::string((string *)(shadowing_disk_file.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_68);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
    uVar2 = google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
                      ((string *)source_tree,(string *)pvVar5,
                       (string *)(shadowing_disk_file.field_2._M_local_buf + 8));
    switch(uVar2) {
    case 0:
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
      std::__cxx11::string::operator=
                ((string *)pvVar5,(string *)(shadowing_disk_file.field_2._M_local_buf + 8));
    default:
      bVar1 = false;
      break;
    case 1:
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
      poVar8 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
      poVar8 = std::operator<<(poVar8,": Input is shadowed in the --proto_path by \"");
      poVar8 = std::operator<<(poVar8,local_68);
      poVar8 = std::operator<<(poVar8,
                               "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
                              );
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      bVar1 = true;
      break;
    case 2:
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
      poVar8 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
      poVar8 = std::operator<<(poVar8,": ");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      poVar8 = std::operator<<(poVar8,pcVar7);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      bVar1 = true;
      break;
    case 3:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar3 = access(pcVar7,0);
      if (iVar3 < 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
        poVar8 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
        poVar8 = std::operator<<(poVar8,": ");
        pcVar7 = strerror(2);
        poVar8 = std::operator<<(poVar8,pcVar7);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->input_files_,(long)(int)virtual_file.field_2._12_4_);
        poVar8 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
        poVar8 = std::operator<<(poVar8,
                                 ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                                );
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)(shadowing_disk_file.field_2._M_local_buf + 8));
    if (bVar1) goto LAB_0017c7ae;
  }
  this_local._7_1_ = 1;
LAB_0017c7ae:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::MakeInputsBeProtoPathRelative(
    DiskSourceTree* source_tree) {
  for (int i = 0; i < input_files_.size(); i++) {
    string virtual_file, shadowing_disk_file;
    switch (source_tree->DiskFileToVirtualFile(
        input_files_[i], &virtual_file, &shadowing_disk_file)) {
      case DiskSourceTree::SUCCESS:
        input_files_[i] = virtual_file;
        break;
      case DiskSourceTree::SHADOWED:
        cerr << input_files_[i] << ": Input is shadowed in the --proto_path "
                "by \"" << shadowing_disk_file << "\".  Either use the latter "
                "file as your input or reorder the --proto_path so that the "
                "former file's location comes first." << endl;
        return false;
      case DiskSourceTree::CANNOT_OPEN:
        cerr << input_files_[i] << ": " << strerror(errno) << endl;
        return false;
      case DiskSourceTree::NO_MAPPING:
        // First check if the file exists at all.
        if (access(input_files_[i].c_str(), F_OK) < 0) {
          // File does not even exist.
          cerr << input_files_[i] << ": " << strerror(ENOENT) << endl;
        } else {
          cerr << input_files_[i] << ": File does not reside within any path "
                  "specified using --proto_path (or -I).  You must specify a "
                  "--proto_path which encompasses this file.  Note that the "
                  "proto_path must be an exact prefix of the .proto file "
                  "names -- protoc is too dumb to figure out when two paths "
                  "(e.g. absolute and relative) are equivalent (it's harder "
                  "than you think)." << endl;
        }
        return false;
    }
  }

  return true;
}